

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DifferentialTest.h
# Opt level: O0

bool DiffTest<Blob<64>,Blob<256>>(pfHash hash,int diffbits,int reps,bool dumpCollisions)

{
  bool bVar1;
  byte in_CL;
  uint in_EDX;
  uint in_ESI;
  code *in_RDI;
  bool result;
  int i;
  Blob<256> h2;
  Blob<256> h1;
  Blob<64> k2;
  Blob<64> k1;
  vector<Blob<64>,_std::allocator<Blob<64>_>_> diffs;
  Rand r;
  double expected;
  double testcount;
  double diffcount;
  int hashbits;
  int keybits;
  uint32_t in_stack_ffffffffffffff0c;
  Rand *in_stack_ffffffffffffff10;
  vector<Blob<64>,_std::allocator<Blob<64>_>_> *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  Rand *this;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  byte bVar2;
  int start;
  int iVar3;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  vector<Blob<64>,_std::allocator<Blob<64>_>_> *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff60;
  undefined1 local_9c [4];
  vector<Blob<64>,_std::allocator<Blob<64>_>_> *in_stack_ffffffffffffff68;
  Blob<64> local_7c [2];
  vector<Blob<64>,_std::allocator<Blob<64>_>_> local_68 [2];
  double local_38;
  Rand *local_30;
  double local_28;
  undefined4 local_1c;
  undefined4 local_18;
  byte local_11;
  uint local_10;
  uint local_c;
  code *local_8;
  
  local_11 = in_CL & 1;
  local_18 = 0x40;
  local_1c = 0x100;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  local_28 = chooseUpToK((int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                         (int)in_stack_ffffffffffffff10);
  this = (Rand *)(local_28 * (double)(int)local_10);
  local_30 = this;
  local_38 = pow(2.0,256.0);
  local_38 = (double)this / local_38;
  Rand::Rand(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  std::vector<Blob<64>,_std::allocator<Blob<64>_>_>::vector
            ((vector<Blob<64>,_std::allocator<Blob<64>_>_> *)0x19bd01);
  Blob<64>::Blob((Blob<64> *)local_68);
  Blob<64>::Blob(local_7c);
  Blob<256>::Blob((Blob<256> *)local_9c);
  Blob<256>::Blob((Blob<256> *)&stack0xffffffffffffff44);
  printf("Testing %0.f up-to-%d-bit differentials in %d-bit keys -> %d bit hashes.\n",local_28,
         (ulong)local_c,0x40,0x100);
  printf("%d reps, %0.f total tests, expecting %2.2f random collisions",local_30,local_38,
         (ulong)local_10);
  start = 0;
  while (start < (int)local_10) {
    iVar3 = start;
    if (start % ((int)local_10 / 10) == 0) {
      printf(".");
    }
    Rand::rand_p(this,(void *)CONCAT44(start,in_stack_ffffffffffffff28),
                 (int)((ulong)in_stack_ffffffffffffff20 >> 0x20));
    in_stack_ffffffffffffff20 = local_68;
    Blob<64>::operator=(local_7c,(Blob<64> *)in_stack_ffffffffffffff20);
    (*local_8)(in_stack_ffffffffffffff20,8,0,local_9c);
    DiffTestRecurse<Blob<64>,Blob<256>>
              ((pfHash)in_stack_ffffffffffffff50,
               (Blob<64> *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
               (Blob<64> *)CONCAT44(in_stack_ffffffffffffff44,iVar3),
               (Blob<256> *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
               (Blob<256> *)this,start,in_stack_ffffffffffffff60,in_stack_ffffffffffffff68);
    start = iVar3 + 1;
  }
  printf("\n");
  bVar2 = 1;
  bVar1 = ProcessDifferentials<Blob<64>>
                    (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                     SUB41(in_stack_ffffffffffffff48,3));
  std::vector<Blob<64>,_std::allocator<Blob<64>_>_>::~vector(in_stack_ffffffffffffff20);
  return (bVar2 & 1 & bVar1) != 0;
}

Assistant:

bool DiffTest ( pfHash hash, int diffbits, int reps, bool dumpCollisions )
{
  const int keybits = sizeof(keytype) * 8;
  const int hashbits = sizeof(hashtype) * 8;

  double diffcount = chooseUpToK(keybits,diffbits);
  double testcount = (diffcount * double(reps));
  double expected  = testcount / pow(2.0,double(hashbits));

  Rand r(100);

  std::vector<keytype> diffs;

  keytype k1,k2;
  hashtype h1,h2;

  printf("Testing %0.f up-to-%d-bit differentials in %d-bit keys -> %d bit hashes.\n",
         diffcount,diffbits,keybits,hashbits);
  printf("%d reps, %0.f total tests, expecting %2.2f random collisions",
         reps,testcount,expected);

  for(int i = 0; i < reps; i++)
  {
    if(i % (reps/10) == 0) printf(".");

    r.rand_p(&k1,sizeof(keytype));
    k2 = k1;

    hash(&k1,sizeof(k1),0,(uint32_t*)&h1);

    DiffTestRecurse<keytype,hashtype>(hash,k1,k2,h1,h2,0,diffbits,diffs);
  }
  printf("\n");

  bool result = true;

  result &= ProcessDifferentials(diffs,reps,dumpCollisions);

  return result;
}